

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O0

void __thiscall KDReports::Test::testFontScaling(Test *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  AutoTableElement *pAVar6;
  reference pQVar7;
  QFont *pQVar8;
  QModelIndex local_240;
  QRect local_228;
  QList<QRect> local_218;
  double local_200;
  double local_1f8;
  QList<QRect> local_1f0;
  QLatin1String local_1d8;
  QString local_1c8;
  QFont local_1b0 [16];
  QModelIndex local_1a0;
  QRect local_188;
  QList<QRect> local_178;
  QRect local_160;
  QList<QRect> local_150;
  QList<QRect> local_138;
  int local_120;
  qint32 local_11c;
  int rowsFirstPage;
  qsizetype local_100;
  undefined4 local_f4;
  AutoTableElement local_f0 [8];
  AutoTableElement tableElement;
  QLatin1String local_d0;
  QString local_c0;
  QFont local_a8 [16];
  Report local_98 [8];
  Report report;
  QLatin1Char local_7f;
  QChar local_7e [7];
  QString local_70;
  QString local_58;
  QString local_40;
  QByteArray local_28;
  Test *local_10;
  Test *this_local;
  
  local_10 = this;
  if (fontFound) {
    fillModel(this,2,0x19,false);
    KDReports::Report::Report(local_98,(QObject *)0x0);
    KDReports::Report::setReportMode((ReportMode)local_98);
    QLatin1String::QLatin1String(&local_d0,"Noto Sans");
    QString::QString(&local_c0,local_d0);
    QFont::QFont(local_a8,&local_c0,0x18,-1,false);
    KDReports::Report::setDefaultFont((QFont *)local_98);
    QFont::~QFont(local_a8);
    QString::~QString(&local_c0);
    KDReports::AutoTableElement::AutoTableElement(local_f0,(QAbstractItemModel *)&this->m_model);
    KDReports::AutoTableElement::setHorizontalHeaderVisible(SUB81(local_f0,0));
    KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(local_f0,0));
    pAVar6 = (AutoTableElement *)KDReports::Report::mainTable();
    KDReports::MainTable::setAutoTableElement(pAVar6);
    iVar3 = KDReports::Report::numberOfPages();
    bVar1 = QTest::qCompare(iVar3,2,"report.numberOfPages()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                            ,0x54);
    if ((bVar1 & 1) == 0) {
      local_f4 = 1;
    }
    else {
      KDReports::Report::mainTable();
      KDReports::MainTable::pageRects();
      local_100 = QList<QRect>::count((QList<QRect> *)&rowsFirstPage);
      local_11c = 2;
      bVar2 = QTest::qCompare<long_long,int>
                        (&local_100,&local_11c,"report.mainTable()->pageRects().count()","2",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                         ,0x55);
      QList<QRect>::~QList((QList<QRect> *)&rowsFirstPage);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        pQVar7 = QList<QRect>::operator[](&local_138,0);
        iVar3 = QRect::height(pQVar7);
        QList<QRect>::~QList(&local_138);
        local_120 = iVar3;
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        pQVar7 = QList<QRect>::operator[](&local_150,0);
        QRect::QRect(&local_160,0,0,2,local_120);
        bVar2 = QTest::qCompare<QRect,QRect>
                          (pQVar7,&local_160,"report.mainTable()->pageRects()[0]",
                           "QRect(0, 0, 2, rowsFirstPage)",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x59);
        QList<QRect>::~QList(&local_150);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          KDReports::Report::mainTable();
          KDReports::MainTable::pageRects();
          pQVar7 = QList<QRect>::operator[](&local_178,1);
          iVar3 = local_120;
          QModelIndex::QModelIndex(&local_1a0);
          iVar4 = QStandardItemModel::rowCount((QModelIndex *)&this->m_model);
          QRect::QRect(&local_188,0,iVar3,2,iVar4 - local_120);
          bVar2 = QTest::qCompare<QRect,QRect>
                            (pQVar7,&local_188,"report.mainTable()->pageRects()[1]",
                             "QRect(0, rowsFirstPage, 2, m_model.rowCount() - rowsFirstPage)",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x5a);
          QList<QRect>::~QList(&local_178);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            KDReports::AutoTableElement::setHorizontalHeaderVisible(SUB81(local_f0,0));
            pAVar6 = (AutoTableElement *)KDReports::Report::mainTable();
            KDReports::MainTable::setAutoTableElement(pAVar6);
            pQVar8 = (QFont *)KDReports::Report::mainTable();
            QLatin1String::QLatin1String(&local_1d8,"Noto Sans");
            QString::QString(&local_1c8,local_1d8);
            QFont::QFont(local_1b0,&local_1c8,0x30,-1,false);
            KDReports::MainTable::setHorizontalHeaderFont(pQVar8);
            QFont::~QFont(local_1b0);
            QString::~QString(&local_1c8);
            iVar3 = KDReports::Report::numberOfPages();
            bVar1 = QTest::qCompare(iVar3,2,"report.numberOfPages()","2",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                    ,0x60);
            if ((bVar1 & 1) == 0) {
              local_f4 = 1;
            }
            else {
              KDReports::Report::mainTable();
              KDReports::MainTable::pageRects();
              pQVar7 = QList<QRect>::operator[](&local_1f0,0);
              iVar3 = QRect::height(pQVar7);
              bVar1 = QTest::qVerify(iVar3 < local_120,
                                     "report.mainTable()->pageRects()[0].height() < rowsFirstPage",
                                     "",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0x61);
              QList<QRect>::~QList(&local_1f0);
              if (((bVar1 ^ 0xff) & 1) == 0) {
                KDReports::Report::setFontScalingFactor(0.2);
                iVar3 = KDReports::Report::numberOfPages();
                bVar1 = QTest::qCompare(iVar3,1,"report.numberOfPages()","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                        ,0x65);
                if ((bVar1 & 1) == 0) {
                  local_f4 = 1;
                }
                else {
                  KDReports::Report::mainTable();
                  local_1f8 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
                  local_200 = 0.2;
                  bVar1 = QTest::qCompare(&local_1f8,&local_200,
                                          "report.mainTable()->lastAutoFontScalingFactor()","0.2",
                                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                          ,0x66);
                  if (((bVar1 ^ 0xff) & 1) == 0) {
                    KDReports::Report::mainTable();
                    KDReports::MainTable::pageRects();
                    pQVar7 = QList<QRect>::operator[](&local_218,0);
                    QModelIndex::QModelIndex(&local_240);
                    iVar3 = QStandardItemModel::rowCount((QModelIndex *)&this->m_model);
                    QRect::QRect(&local_228,0,0,2,iVar3);
                    bVar2 = QTest::qCompare<QRect,QRect>
                                      (pQVar7,&local_228,"report.mainTable()->pageRects()[0]",
                                       "QRect(0, 0, 2, m_model.rowCount())",
                                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                       ,0x67);
                    QList<QRect>::~QList(&local_218);
                    if (((bVar2 ^ 0xffU) & 1) == 0) {
                      local_f4 = 0;
                    }
                    else {
                      local_f4 = 1;
                    }
                  }
                  else {
                    local_f4 = 1;
                  }
                }
              }
              else {
                local_f4 = 1;
              }
            }
          }
          else {
            local_f4 = 1;
          }
        }
        else {
          local_f4 = 1;
        }
      }
      else {
        local_f4 = 1;
      }
    }
    KDReports::AutoTableElement::~AutoTableElement(local_f0);
    KDReports::Report::~Report(local_98);
  }
  else {
    QString::QString(&local_58,"Font %1 not found");
    QString::QString(&local_70,"Noto Sans");
    QLatin1Char::QLatin1Char(&local_7f,' ');
    QChar::QChar(local_7e,local_7f);
    QString::arg(&local_40,(int)&local_58,(QChar *)&local_70);
    QString::toLatin1(&local_28,&local_40);
    pcVar5 = QByteArray::operator_cast_to_char_(&local_28);
    QTest::qSkip(pcVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                 ,0x4a);
    QByteArray::~QByteArray(&local_28);
    QString::~QString(&local_40);
    QString::~QString(&local_70);
    QString::~QString(&local_58);
  }
  return;
}

Assistant:

void testFontScaling()
    {
        SKIP_IF_FONT_NOT_FOUND

        fillModel(2, 25);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 24));
        AutoTableElement tableElement(&m_model);
        tableElement.setHorizontalHeaderVisible(false);
        tableElement.setVerticalHeaderVisible(false);
        report.mainTable()->setAutoTableElement(tableElement);
        QCOMPARE(report.numberOfPages(), 2);
        QCOMPARE(report.mainTable()->pageRects().count(), 2);

#ifndef Q_OS_MAC // Somehow the mac gets different font size for the headers, even compared to linux with DPI 72.
        const int rowsFirstPage = report.mainTable()->pageRects()[0].height();
        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, 2, rowsFirstPage));
        QCOMPARE(report.mainTable()->pageRects()[1], QRect(0, rowsFirstPage, 2, m_model.rowCount() - rowsFirstPage));

        // Now show a huge horizontal header, and check we have less rows per page
        tableElement.setHorizontalHeaderVisible(true);
        report.mainTable()->setAutoTableElement(tableElement);
        report.mainTable()->setHorizontalHeaderFont(QFont(QLatin1String(s_fontName), 48));
        QCOMPARE(report.numberOfPages(), 2);
        QVERIFY(report.mainTable()->pageRects()[0].height() < rowsFirstPage);

        // Now force a very small font scaling factor
        report.setFontScalingFactor(0.2);
        QCOMPARE(report.numberOfPages(), 1);
        QCOMPARE(report.mainTable()->lastAutoFontScalingFactor(), 0.2);
        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, 2, m_model.rowCount()));
#endif
    }